

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitWithIndent_Test::TestBody
          (PrinterTest_EmitWithIndent_Test *this)

{
  long *plVar1;
  ZeroCopyOutputStream *output;
  char *message;
  long lVar2;
  Printer printer;
  AssertHelper AStack_3f8;
  size_t local_3f0;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [176];
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_2d8;
  TypeErasedState local_2b8;
  ManagerType *local_2a8;
  undefined1 auStack_2a0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  char acStack_260 [8];
  undefined1 local_258 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  Sub local_1a0;
  Sub local_e8;
  
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer((Printer *)local_388,output);
  local_3f0 = local_388._88_8_;
  local_388._104_8_ = local_388._104_8_ + local_388._88_8_;
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"f1","");
  Printer::Sub::Sub<char_const(&)[2]>
            ((Sub *)local_258,&local_3e8,(char (*) [2])(anon_var_dwarf_110ca8b + 8));
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"f2","");
  Printer::Sub::Sub<char_const(&)[2]>(&local_1a0,&local_3a8,(char (*) [2])0x1428c44);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"f3","");
  Printer::Sub::Sub<char_const(&)[2]>(&local_e8,&local_3c8,(char (*) [2])0x120dec2);
  Printer::Emit((Printer *)local_388,local_258,3,0x3e,
                "\n      class Foo {\n        int $f1$, $f2$, $f3$;\n      };\n    ");
  lVar2 = 0x228;
  do {
    if (acStack_260[lVar2] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (auStack_2a0 + lVar2));
    }
    plVar1 = *(long **)((long)&local_2d8.
                               super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar2);
    if ((long *)(local_2b8.storage + lVar2) != plVar1) {
      operator_delete(plVar1,*(long *)(local_2b8.storage + lVar2) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr
      [*(byte *)((long)&local_2d8.
                        super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + lVar2)]._M_data)
              ((anon_class_1_0_00000001 *)&AStack_3f8,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_388 + lVar2 + 0x98));
    *(undefined1 *)
     ((long)&local_2d8.
             super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar2) = 0xff;
    if ((long *)(local_388 + lVar2 + 0x88) != *(long **)(local_388 + lVar2 + 0x78)) {
      operator_delete(*(long **)(local_388 + lVar2 + 0x78),*(long *)(local_388 + lVar2 + 0x88) + 1);
    }
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_388._104_8_ = local_388._104_8_ - local_3f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)(auStack_2a0 + 8));
  (*local_2a8)(dispose,&local_2b8,&local_2b8);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_2d8);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             *)(local_388 + 0x98));
  if ((pointer)local_388._128_8_ != (pointer)0x0) {
    operator_delete((void *)local_388._128_8_,local_388._144_8_ - local_388._128_8_);
  }
  if (local_388._16_8_ != 0) {
    (*(*(_func_int ***)local_388._0_8_)[3])();
  }
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  local_388._8_8_ = (this->super_PrinterTest).out_._M_dataplus._M_p;
  local_388._0_8_ = (this->super_PrinterTest).out_._M_string_length;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[37]>
            ((internal *)local_258,"written()",
             "\"  class Foo {\\n\" \"    int x, y, z;\\n\" \"  };\\n\"",
             (basic_string_view<char,_std::char_traits<char>_> *)local_388,
             (char (*) [37])"  class Foo {\n    int x, y, z;\n  };\n");
  if (local_258[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_250 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_250->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x2c9,message);
    testing::internal::AssertHelper::operator=(&AStack_3f8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&AStack_3f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_388._0_8_)[1])();
    }
  }
  if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_250,local_250);
  }
  return;
}

Assistant:

TEST_F(PrinterTest, EmitWithIndent) {
  {
    Printer printer(output());
    auto v = printer.WithIndent();
    printer.Emit({{"f1", "x"}, {"f2", "y"}, {"f3", "z"}}, R"cc(
      class Foo {
        int $f1$, $f2$, $f3$;
      };
    )cc");
  }

  EXPECT_EQ(written(),
            "  class Foo {\n"
            "    int x, y, z;\n"
            "  };\n");
}